

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O2

void __thiscall QResourceFileEnginePrivate::uncompress(QResourceFileEnginePrivate *this)

{
  QResource *this_00;
  qsizetype qVar1;
  Data *pDVar2;
  char *pcVar3;
  Compression CVar4;
  qint64 qVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->resource;
  CVar4 = QResource::compressionAlgorithm(this_00);
  if ((CVar4 != NoCompression) && ((this->uncompressed).d.size == 0)) {
    qVar5 = QResource::size(this_00);
    if (qVar5 != 0) {
      QResource::uncompressedData((QByteArray *)&local_38,this_00);
      pDVar2 = (this->uncompressed).d.d;
      pcVar3 = (this->uncompressed).d.ptr;
      (this->uncompressed).d.d = local_38.d;
      (this->uncompressed).d.ptr = local_38.ptr;
      qVar1 = (this->uncompressed).d.size;
      (this->uncompressed).d.size = local_38.size;
      local_38.d = pDVar2;
      local_38.ptr = pcVar3;
      local_38.size = qVar1;
      QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QResourceFileEnginePrivate::uncompress() const
{
    if (resource.compressionAlgorithm() == QResource::NoCompression
            || !uncompressed.isEmpty() || resource.size() == 0)
        return;     // nothing to do
    uncompressed = resource.uncompressedData();
}